

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedCollator::getReorderCodes
          (RuleBasedCollator *this,int32_t *dest,int32_t capacity,UErrorCode *errorCode)

{
  int iVar1;
  int iVar2;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if ((-1 < capacity) && (capacity == 0 || dest != (int32_t *)0x0)) {
    iVar1 = this->settings->reorderCodesLength;
    iVar2 = 0;
    if ((long)iVar1 != 0) {
      iVar2 = iVar1;
      if (capacity < iVar1) {
        *errorCode = U_BUFFER_OVERFLOW_ERROR;
      }
      else {
        memcpy(dest,this->settings->reorderCodes,(long)iVar1 << 2);
      }
    }
    return iVar2;
  }
  *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

int32_t
RuleBasedCollator::getReorderCodes(int32_t *dest, int32_t capacity,
                                   UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(capacity < 0 || (dest == NULL && capacity > 0)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t length = settings->reorderCodesLength;
    if(length == 0) { return 0; }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return length;
    }
    uprv_memcpy(dest, settings->reorderCodes, length * 4);
    return length;
}